

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaExist.c
# Opt level: O2

Gia_Man_t *
Gia_ManQuantExist2Dup
          (Gia_Man_t *p,int iLit,Vec_Int_t *vCis,Vec_Int_t *vSide,Vec_Int_t *vAnds,int *pOutLit)

{
  Vec_Int_t *p_00;
  int iVar1;
  int iVar2;
  int iVar3;
  Gia_Man_t *p_01;
  Gia_Obj_t *pGVar4;
  int Fill;
  int iVar5;
  
  p_01 = Gia_ManStart(vAnds->nSize * 10 + vCis->nSize + vSide->nSize);
  Gia_ManQuantSetSuppStart(p_01);
  Gia_ManHashStart(p_01);
  p_00 = &p->vCopies;
  if ((p->vCopies).nSize < p->nObjs) {
    Vec_IntFillExtra(p_00,p->nObjs,Fill);
  }
  for (iVar5 = 0; iVar5 < vSide->nSize; iVar5 = iVar5 + 1) {
    iVar1 = Vec_IntEntry(vSide,iVar5);
    iVar2 = Gia_ManAppendCi(p_01);
    Vec_IntWriteEntry(p_00,iVar1,iVar2);
    Gia_ManQuantSetSuppZero(p_01);
  }
  for (iVar5 = 0; iVar5 < vCis->nSize; iVar5 = iVar5 + 1) {
    iVar1 = Vec_IntEntry(vCis,iVar5);
    iVar2 = Gia_ManAppendCi(p_01);
    Vec_IntWriteEntry(p_00,iVar1,iVar2);
    Gia_ManQuantSetSuppZero(p_01);
    iVar1 = Abc_Lit2Var(iVar2);
    pGVar4 = Gia_ManObj(p_01,iVar1);
    Gia_ManQuantSetSuppCi(p_01,pGVar4);
  }
  for (iVar5 = 0; iVar5 < vAnds->nSize; iVar5 = iVar5 + 1) {
    iVar1 = Vec_IntEntry(vAnds,iVar5);
    pGVar4 = Gia_ManObj(p,iVar1);
    iVar2 = Vec_IntEntry(p_00,iVar1 - (*(uint *)pGVar4 & 0x1fffffff));
    iVar3 = Vec_IntEntry(p_00,iVar1 - (*(uint *)&pGVar4->field_0x4 & 0x1fffffff));
    iVar2 = Abc_LitNotCond(iVar2,*(uint *)pGVar4 >> 0x1d & 1);
    iVar3 = Abc_LitNotCond(iVar3,(uint)((ulong)*(undefined8 *)pGVar4 >> 0x3d) & 1);
    iVar2 = Gia_ManHashAnd(p_01,iVar2,iVar3);
    Vec_IntWriteEntry(p_00,iVar1,iVar2);
  }
  iVar5 = Abc_Lit2Var(iLit);
  iVar5 = Vec_IntEntry(p_00,iVar5);
  iVar1 = Abc_LitIsCompl(iLit);
  iVar5 = Abc_LitNotCond(iVar5,iVar1);
  if (pOutLit != (int *)0x0) {
    *pOutLit = iVar5;
  }
  for (iVar5 = 0; iVar5 < vSide->nSize; iVar5 = iVar5 + 1) {
    iVar1 = Vec_IntEntry(vSide,iVar5);
    Vec_IntWriteEntry(p_00,iVar1,-1);
  }
  for (iVar5 = 0; iVar5 < vCis->nSize; iVar5 = iVar5 + 1) {
    iVar1 = Vec_IntEntry(vCis,iVar5);
    Vec_IntWriteEntry(p_00,iVar1,-1);
  }
  for (iVar5 = 0; iVar5 < vAnds->nSize; iVar5 = iVar5 + 1) {
    iVar1 = Vec_IntEntry(vAnds,iVar5);
    Vec_IntWriteEntry(p_00,iVar1,-1);
  }
  return p_01;
}

Assistant:

Gia_Man_t * Gia_ManQuantExist2Dup( Gia_Man_t * p, int iLit, Vec_Int_t * vCis, Vec_Int_t * vSide, Vec_Int_t * vAnds, int * pOutLit )
{
    int i, iObj, iLit0, iLit1, iLitR;
    Gia_Man_t * pNew = Gia_ManStart( Vec_IntSize(vSide) + Vec_IntSize(vCis) + 10*Vec_IntSize(vAnds) );
    Gia_ManQuantSetSuppStart( pNew );
    Gia_ManHashStart( pNew ); 
    if ( Vec_IntSize(&p->vCopies) < Gia_ManObjNum(p) )
        Vec_IntFillExtra( &p->vCopies, Gia_ManObjNum(p), -1 );
    Vec_IntForEachEntry( vSide, iObj, i )
    {
        Gia_ObjSetCopyArray( p, iObj, Gia_ManAppendCi(pNew) );
        Gia_ManQuantSetSuppZero( pNew );
    }
    Vec_IntForEachEntry( vCis,  iObj, i )
    {
        Gia_ObjSetCopyArray( p, iObj, (iLit0 = Gia_ManAppendCi(pNew)) );
        Gia_ManQuantSetSuppZero( pNew );
        Gia_ManQuantSetSuppCi( pNew, Gia_ManObj(pNew, Abc_Lit2Var(iLit0)) );
    }
    Vec_IntForEachEntry( vAnds, iObj, i )
    {
        Gia_Obj_t * pObj = Gia_ManObj( p, iObj );
        iLit0 = Gia_ObjCopyArray( p, Gia_ObjFaninId0(pObj, iObj) );
        iLit1 = Gia_ObjCopyArray( p, Gia_ObjFaninId1(pObj, iObj) );
        iLit0 = Abc_LitNotCond( iLit0, Gia_ObjFaninC0(pObj) );
        iLit1 = Abc_LitNotCond( iLit1, Gia_ObjFaninC1(pObj) );
        iLitR = Gia_ManHashAnd( pNew, iLit0, iLit1 );
        Gia_ObjSetCopyArray( p, iObj, iLitR );
    }
    iLit0 = Gia_ObjCopyArray( p, Abc_Lit2Var(iLit) );
    iLit0 = Abc_LitNotCond( iLit0, Abc_LitIsCompl(iLit) );
    if ( pOutLit ) *pOutLit = iLit0;
    Vec_IntForEachEntry( vSide, iObj, i )
        Gia_ObjSetCopyArray( p, iObj, -1 );
    Vec_IntForEachEntry( vCis,  iObj, i )
        Gia_ObjSetCopyArray( p, iObj, -1 );
    Vec_IntForEachEntry( vAnds, iObj, i )
        Gia_ObjSetCopyArray( p, iObj, -1 );
    return pNew;
}